

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_init_temp_ext(float temp,float delta,float exponent)

{
  undefined4 *puVar1;
  llama_sampler *plVar2;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  llama_sampler_context_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  puVar1 = (undefined4 *)operator_new(0xc);
  *puVar1 = in_XMM0_Da;
  puVar1[1] = in_XMM1_Da;
  puVar1[2] = in_XMM2_Da;
  plVar2 = llama_sampler_init((llama_sampler_i *)CONCAT44(in_XMM2_Da,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffe8);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_temp_ext(float temp, float delta, float exponent) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_temp_ext_i,
        /* .ctx   = */ new llama_sampler_temp_ext {
            /* .temp     = */ temp,
            /* .delta    = */ delta,
            /* .exponent = */ exponent,
        }
    );
}